

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
bwtil::IndexedBWT::BS
          (IndexedBWT *this,ulint W,uint length,pair<unsigned_long,_unsigned_long> interval)

{
  byte bVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  uint uVar3;
  byte *pbVar4;
  reference pvVar5;
  ulint uVar6;
  unsigned_long in_RCX;
  uint in_EDX;
  ulint in_RSI;
  IndexedBWT *in_RDI;
  ulint in_R8;
  value_type c;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  value_type vVar7;
  IndexedBWT *in_stack_ffffffffffffffa8;
  uint local_40;
  unsigned_long local_28;
  ulint uStack_20;
  
  uStack_20 = in_R8;
  if ((in_RCX == 0) && (in_R8 == 0)) {
    uStack_20 = in_RDI->n;
  }
  local_28 = in_RCX;
  for (local_40 = 0; local_40 < in_EDX; local_40 = local_40 + 1) {
    this_00 = &in_RDI->remapping;
    uVar3 = digitAt(in_RDI,in_RSI,local_40);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (this_00,(ulong)(uVar3 + 1));
    bVar1 = *pbVar4;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->FIRST,(ulong)bVar1);
    vVar7 = *pvVar5;
    uVar6 = rank(in_stack_ffffffffffffffa8,(uchar)(vVar7 >> 0x38),(ulint)this_00);
    local_28 = vVar7 + uVar6;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->FIRST,(ulong)bVar1);
    in_stack_ffffffffffffffa8 = (IndexedBWT *)*pvVar5;
    uStack_20 = rank(in_stack_ffffffffffffffa8,(uchar)(vVar7 >> 0x38),(ulint)this_00);
    uStack_20 = (long)&in_stack_ffffffffffffffa8->sigma + uStack_20;
  }
  pVar2.second = uStack_20;
  pVar2.first = local_28;
  return pVar2;
}

Assistant:

pair<ulint, ulint> BS(ulint W, uint length,pair<ulint, ulint> interval= pair<ulint, ulint>(0,0)){

		if(interval.first==0 and interval.second==0)//if default interval
			interval.second = n;

		for(uint i=0;i<length;i++){

			auto c = remapping[digitAt(W,i)+1];//sum 1 since the BWT is built on the remapped text, where 1 is added to each digit

			interval.first = FIRST[c] + rank(c,interval.first);
			interval.second = FIRST[c] + rank(c,interval.second);

		}

		return interval;

	}